

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GcodePovray.cpp
# Opt level: O0

double * __thiscall vector3::operator[](vector3 *this,int index)

{
  undefined8 *puVar1;
  int index_local;
  vector3 *this_local;
  
  this_local = this;
  if (index != 0) {
    if (index == 1) {
      this_local = (vector3 *)&this->y;
    }
    else {
      if (index != 2) {
        puVar1 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar1 = "out of range";
        __cxa_throw(puVar1,&char_const*::typeinfo,0);
      }
      this_local = (vector3 *)&this->z;
    }
  }
  return &this_local->x;
}

Assistant:

double& operator [] (int index)
  {
    if (index == 0)
    {
      return x;
    }

    if (index == 1)
    {
      return y;
    }

    if (index == 2)
    {
      return z;
    }

    throw "out of range";
  }